

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

void __thiscall iDynTree::optimalcontrol::MeshPointOrigin::MeshPointOrigin(MeshPointOrigin *this)

{
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> local_1d [13];
  allocator<char> *in_stack_fffffffffffffff0;
  char *__s;
  
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,__s,in_stack_fffffffffffffff0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,__s,in_stack_fffffffffffffff0);
  std::allocator<char>::~allocator(local_1d);
  in_RDI[0x40] = -1;
  in_RDI[0x41] = -1;
  in_RDI[0x42] = -1;
  in_RDI[0x43] = -1;
  return;
}

Assistant:

MeshPointOrigin()
            :m_name("ERROR")
            ,m_description("A meshPointOrigin not initialized")
            ,m_priority(-1)
            {}